

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_Empty_Test::TestBody
          (CordOutputStreamTest_Empty_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_b0;
  AssertHelper local_90;
  Message local_88 [3];
  undefined1 local_70 [24];
  undefined1 local_58 [8];
  AssertionResult gtest_ar_;
  CordOutputStream output;
  CordOutputStreamTest_Empty_Test *this_local;
  
  CordOutputStream::CordOutputStream((CordOutputStream *)&gtest_ar_.message_,0);
  CordOutputStream::Consume((CordOutputStream *)local_70);
  local_70[0x17] = absl::lts_20250127::Cord::empty((Cord *)local_70);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_58,(bool *)(local_70 + 0x17),(type *)0x0);
  absl::lts_20250127::Cord::~Cord((Cord *)local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_58,(AssertionResult *)"output.Consume().empty()","false",
               "true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x3e2,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  CordOutputStream::~CordOutputStream((CordOutputStream *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(CordOutputStreamTest, Empty) {
  CordOutputStream output;
  EXPECT_TRUE(output.Consume().empty());
}